

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codedump.c
# Opt level: O2

void dump_task_struct(task_struct *t)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  
  printf("head  %#lx %#lx\n",t->vhead,t->phead);
  printf("state  %#lx %#lx\n",t->vstate,t->pstate);
  printf("pid  %#lx %#lx\n",t->vpid,t->ppid);
  printf("children  %#lx %#lx\n",t->vchildren,t->pchildren);
  printf("sibling  %#lx %#lx\n",t->vsibling,t->psibling);
  printf("comm  %#lx %#lx\n",t->vcomm,t->pcomm);
  printf("real_parent  %#lx %#lx\n",t->vreal_parent,t->preal_parent);
  uVar1 = t->children_next;
  lVar3 = 0x778000000000;
  lVar2 = 0x778000000000;
  if (0xffffffff7fffffff < uVar1) {
    lVar2 = 0x81000000;
  }
  printf("children_next %#lx %#lx\n",uVar1,lVar2 + uVar1);
  uVar1 = t->children_prev;
  lVar2 = 0x778000000000;
  if (0xffffffff7fffffff < uVar1) {
    lVar2 = 0x81000000;
  }
  printf("children_prev %#lx %#lx\n",uVar1,lVar2 + uVar1);
  uVar1 = t->sibling_next;
  lVar2 = 0x778000000000;
  if (0xffffffff7fffffff < uVar1) {
    lVar2 = 0x81000000;
  }
  printf("sibling_next %#lx %#lx\n",uVar1,lVar2 + uVar1);
  uVar1 = t->sibling_prev;
  if (0xffffffff7fffffff < uVar1) {
    lVar3 = 0x81000000;
  }
  printf("sibling_prev %#lx %#lx\n",uVar1,lVar3 + uVar1);
  return;
}

Assistant:

void dump_task_struct(struct task_struct *t)
{
	print_task_value(t, head);
	print_task_value(t, state);
	print_task_value(t, pid);
	print_task_value(t, children);
	print_task_value(t, sibling);
	print_task_value(t, comm);
	print_task_value(t, real_parent);

	printf("children_next %#lx %#lx\n",
	       t->children_next, __phys_addr(t->children_next));
	printf("children_prev %#lx %#lx\n",
	       t->children_prev, __phys_addr(t->children_prev));
	printf("sibling_next %#lx %#lx\n",
	       t->sibling_next, __phys_addr(t->sibling_next));
	printf("sibling_prev %#lx %#lx\n",
	       t->sibling_prev, __phys_addr(t->sibling_prev));
}